

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

mi_page_t * mi_segment_span_allocate(mi_segment_t *segment,size_t slice_index,size_t slice_count)

{
  _Bool _Var1;
  mi_slice_t *pmVar2;
  mi_segment_t *in_RDX;
  long in_RSI;
  mi_segment_t *in_RDI;
  mi_slice_t *end;
  mi_slice_t *last;
  size_t i;
  mi_slice_t *slice_next;
  size_t extra;
  mi_page_t *page;
  size_t bsize;
  mi_slice_t *slice;
  mi_segment_t *size;
  uint8_t *in_stack_ffffffffffffffa0;
  mi_segment_t *in_stack_ffffffffffffffa8;
  mi_slice_t *pmVar3;
  undefined1 *local_50;
  mi_slice_t *local_48;
  undefined1 *local_40;
  size_t *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  mi_slice_t *slice_00;
  mi_page_t *local_8;
  
  slice_00 = in_RDI->slices + in_RSI;
  size = in_RDI;
  _mi_segment_page_start_from_slice
            (in_RDX,slice_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  _Var1 = mi_segment_ensure_committed
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(size_t)size);
  if (_Var1) {
    slice_00->slice_offset = 0;
    slice_00->slice_count = (uint32_t)in_RDX;
    slice_00->block_size = (long)in_RDX << 0x10;
    local_8 = mi_slice_to_page(slice_00);
    local_40 = (undefined1 *)((long)in_RDX[-1].slices[0x200].padding + 7);
    if ((undefined1 *)0xff < local_40) {
      local_40 = (undefined1 *)0xff;
    }
    if ((undefined1 *)in_RDI->slice_entries <= local_40 + in_RSI) {
      local_40 = (undefined1 *)((in_RDI->slice_entries - in_RSI) + -1);
    }
    pmVar3 = slice_00;
    for (local_50 = (undefined1 *)0x1; local_48 = pmVar3 + 1, local_50 <= local_40;
        local_50 = local_50 + 1) {
      pmVar3[1].slice_offset = (int)local_50 * 0x60;
      local_48->slice_count = 0;
      pmVar3[1].block_size = 1;
      pmVar3 = local_48;
    }
    pmVar3 = slice_00 + (long)((long)in_RDX[-1].slices[0x200].padding + 7);
    pmVar2 = mi_segment_slices_end(in_RDI);
    if (pmVar2 < pmVar3) {
      pmVar3 = pmVar2;
    }
    if (slice_00 < pmVar3) {
      pmVar3->slice_offset = (int)(((long)pmVar3 - (long)slice_00) / 0x60) * 0x60;
      pmVar3->slice_count = 0;
      pmVar3->block_size = 1;
    }
    local_8->field_0x8 = local_8->field_0x8 & 0xfe | 1;
    local_8->field_0x8 = local_8->field_0x8 & 0xfb | (in_RDI->kind == MI_SEGMENT_HUGE) << 2;
    in_RDI->used = in_RDI->used + 1;
  }
  else {
    local_8 = (mi_page_t *)0x0;
  }
  return local_8;
}

Assistant:

static mi_page_t* mi_segment_span_allocate(mi_segment_t* segment, size_t slice_index, size_t slice_count) {
  mi_assert_internal(slice_index < segment->slice_entries);
  mi_slice_t* const slice = &segment->slices[slice_index];
  mi_assert_internal(slice->block_size==0 || slice->block_size==1);

  // commit before changing the slice data
  if (!mi_segment_ensure_committed(segment, _mi_segment_page_start_from_slice(segment, slice, 0, NULL), slice_count * MI_SEGMENT_SLICE_SIZE)) {
    return NULL;  // commit failed!
  }

  // convert the slices to a page
  slice->slice_offset = 0;
  slice->slice_count = (uint32_t)slice_count;
  mi_assert_internal(slice->slice_count == slice_count);
  const size_t bsize = slice_count * MI_SEGMENT_SLICE_SIZE;
  slice->block_size = bsize;
  mi_page_t*  page = mi_slice_to_page(slice);
  mi_assert_internal(mi_page_block_size(page) == bsize);

  // set slice back pointers for the first MI_MAX_SLICE_OFFSET_COUNT entries
  size_t extra = slice_count-1;
  if (extra > MI_MAX_SLICE_OFFSET_COUNT) extra = MI_MAX_SLICE_OFFSET_COUNT;
  if (slice_index + extra >= segment->slice_entries) extra = segment->slice_entries - slice_index - 1;  // huge objects may have more slices than avaiable entries in the segment->slices

  mi_slice_t* slice_next = slice + 1;
  for (size_t i = 1; i <= extra; i++, slice_next++) {
    slice_next->slice_offset = (uint32_t)(sizeof(mi_slice_t)*i);
    slice_next->slice_count = 0;
    slice_next->block_size = 1;
  }

  // and also for the last one (if not set already) (the last one is needed for coalescing and for large alignments)
  // note: the cast is needed for ubsan since the index can be larger than MI_SLICES_PER_SEGMENT for huge allocations (see #543)
  mi_slice_t* last = slice + slice_count - 1;
  mi_slice_t* end = (mi_slice_t*)mi_segment_slices_end(segment);
  if (last > end) last = end;
  if (last > slice) {
    last->slice_offset = (uint32_t)(sizeof(mi_slice_t) * (last - slice));
    last->slice_count = 0;
    last->block_size = 1;
  }

  // and initialize the page
  page->is_committed = true;
  page->is_huge = (segment->kind == MI_SEGMENT_HUGE);
  segment->used++;
  return page;
}